

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

ValueType ValueType::Verify(ValueType valueType)

{
  code *pcVar1;
  uint lineNumber;
  bool bVar2;
  ObjectType OVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a [4];
  ValueType valueType_local;
  
  local_1a[0] = valueType.field_0;
  if (valueType.field_0 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x69,"(valueType.bits)","valueType.bits");
    if (!bVar2) goto LAB_009f208a;
    *puVar4 = 0;
LAB_009f1f71:
    bVar2 = AnyOnExcept((ValueType *)&local_1a[0].field_0,IntIsLikelyUntagged|IntCanBeUntagged);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                         ,0x6e,
                         "(valueType.OneOn(Bits::Object) || valueType.OneOn(Bits::Int) || valueType.AnyOnExcept(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged))"
                         ,
                         "valueType.OneOn(Bits::Object) || valueType.OneOn(Bits::Int) || valueType.AnyOnExcept(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged)"
                        );
      if (!bVar2) goto LAB_009f208a;
      *puVar4 = 0;
    }
LAB_009f1fd3:
    if (((ushort)valueType.field_0 & 0xc0) != 0x80) {
      return (ValueType)valueType.field_0.bits;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = 
    "(valueType.OneOn(Bits::Object) || !valueType.AllEqual(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged, Bits::IntIsLikelyUntagged))"
    ;
    message = 
    "valueType.OneOn(Bits::Object) || !valueType.AllEqual(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged, Bits::IntIsLikelyUntagged)"
    ;
    lineNumber = 0x71;
  }
  else {
    if (((ushort)valueType.field_0 & 0x10) == 0) {
      if (((ushort)valueType.field_0 & 0x20) == 0) goto LAB_009f1f71;
      goto LAB_009f1fd3;
    }
    OVar3 = GetObjectType((ValueType *)&local_1a[0].field_0);
    if (OVar3 < Count) {
      return (ValueType)valueType.field_0.bits;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(!valueType.OneOn(Bits::Object) || valueType.GetObjectType() < ObjectType::Count)";
    message = "!valueType.OneOn(Bits::Object) || valueType.GetObjectType() < ObjectType::Count";
    lineNumber = 0x6a;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                     ,lineNumber,error,message);
  if (bVar2) {
    *puVar4 = 0;
    return (ValueType)valueType.field_0;
  }
LAB_009f208a:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

ValueType ValueType::Verify(const ValueType valueType)
{
    Assert(valueType.bits);
    Assert(!valueType.OneOn(Bits::Object) || valueType.GetObjectType() < ObjectType::Count);
    Assert(
        valueType.OneOn(Bits::Object) ||
        valueType.OneOn(Bits::Int) ||
        valueType.AnyOnExcept(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged));
    Assert(
        valueType.OneOn(Bits::Object) ||
        !valueType.AllEqual(Bits::IntCanBeUntagged | Bits::IntIsLikelyUntagged, Bits::IntIsLikelyUntagged));

    return valueType;
}